

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void exp2reg(FuncState *fs,expdesc *e,int reg)

{
  int vtarget;
  int iVar1;
  int iVar2;
  int dtarget;
  
  discharge2reg(fs,e,reg);
  if (e->k == VJMP) {
    luaK_concat(fs,&e->t,(e->u).s.info);
  }
  iVar2 = e->f;
  if (e->t == iVar2) goto LAB_0010c5d0;
  iVar1 = need_value(fs,e->t);
  if (iVar1 == 0) {
    iVar1 = need_value(fs,iVar2);
    if (iVar1 != 0) goto LAB_0010c555;
    dtarget = -1;
    iVar1 = dtarget;
  }
  else {
LAB_0010c555:
    if (e->k == VJMP) {
      iVar2 = -1;
    }
    else {
      iVar2 = luaK_jump(fs);
    }
    dtarget = code_label(fs,reg,0,1);
    iVar1 = code_label(fs,reg,1,0);
    luaK_patchtohere(fs,iVar2);
    iVar2 = e->f;
  }
  vtarget = fs->pc;
  fs->lasttarget = vtarget;
  patchlistaux(fs,iVar2,vtarget,reg,dtarget);
  patchlistaux(fs,e->t,vtarget,reg,iVar1);
LAB_0010c5d0:
  e->t = -1;
  e->f = -1;
  (e->u).s.info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void exp2reg(FuncState*fs,expdesc*e,int reg){
discharge2reg(fs,e,reg);
if(e->k==VJMP)
luaK_concat(fs,&e->t,e->u.s.info);
if(hasjumps(e)){
int final;
int p_f=(-1);
int p_t=(-1);
if(need_value(fs,e->t)||need_value(fs,e->f)){
int fj=(e->k==VJMP)?(-1):luaK_jump(fs);
p_f=code_label(fs,reg,0,1);
p_t=code_label(fs,reg,1,0);
luaK_patchtohere(fs,fj);
}
final=luaK_getlabel(fs);
patchlistaux(fs,e->f,final,reg,p_f);
patchlistaux(fs,e->t,final,reg,p_t);
}
e->f=e->t=(-1);
e->u.s.info=reg;
e->k=VNONRELOC;
}